

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  uint uVar1;
  size_t sVar2;
  long in_R8;
  int unaff_retaddr;
  ZSTD_hufCTablesMetadata_t *in_stack_00000008;
  ZSTD_hufCTables_t *in_stack_00000010;
  ZSTD_hufCTables_t *in_stack_00000018;
  size_t in_stack_00000020;
  void *in_stack_00000028;
  size_t err_code_1;
  size_t err_code;
  int hufFlags;
  int huf_useOptDepth;
  size_t litSize;
  ZSTD_CCtx_params *in_stack_ffffffffffffff68;
  size_t local_8;
  
  ZSTD_literalsCompressionIsDisabled(in_stack_ffffffffffffff68);
  sVar2 = ZSTD_buildBlockEntropyStats_literals
                    (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                     in_stack_00000008,unaff_retaddr,(void *)err_code_1,err_code,hufFlags);
  *(size_t *)(in_R8 + 0x88) = sVar2;
  local_8 = *(size_t *)(in_R8 + 0x88);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    sVar2 = ZSTD_buildBlockEntropyStats_sequences
                      ((seqStore_t *)nextEntropy,(ZSTD_fseCTables_t *)cctxParams,
                       (ZSTD_fseCTables_t *)entropyMetadata,(ZSTD_CCtx_params *)workspace,
                       (ZSTD_fseCTablesMetadata_t *)litSize,
                       (void *)CONCAT44(huf_useOptDepth,hufFlags),wkspSize);
    *(size_t *)(in_R8 + 0x128) = sVar2;
    local_8 = *(size_t *)(in_R8 + 0x128);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}